

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundConfigTab.cpp
# Opt level: O0

void __thiscall
SoundConfigTab::rescan<AudioEnumerator>
          (SoundConfigTab *this,AudioEnumerator *enumerator,DeviceGroup *group)

{
  QComboBox *this_00;
  int iVar1;
  QFlags<Qt::MatchFlag> flags;
  int index;
  undefined1 local_48 [8];
  QString current;
  QSignalBlocker blocker;
  DeviceGroup *group_local;
  AudioEnumerator *enumerator_local;
  SoundConfigTab *this_local;
  
  QSignalBlocker::QSignalBlocker((QSignalBlocker *)&current.d.size,(QObject *)group->mDeviceCombo);
  QComboBox::currentText();
  iVar1 = QComboBox::currentIndex();
  AudioEnumerator::populate(enumerator,iVar1);
  DeviceGroup::populateDevices<AudioEnumerator>(group,enumerator);
  this_00 = group->mDeviceCombo;
  flags = Qt::operator|(MatchExactly,MatchCaseSensitive);
  iVar1 = QComboBox::findText(this_00,(QString *)local_48,(MatchFlags)flags.i);
  if (iVar1 == -1) {
    setDirtyFromEnumerator<AudioEnumerator>(this);
  }
  QComboBox::setCurrentIndex((int)group->mDeviceCombo);
  QString::~QString((QString *)local_48);
  QSignalBlocker::~QSignalBlocker((QSignalBlocker *)&current.d.size);
  return;
}

Assistant:

void SoundConfigTab::rescan(Enumerator &enumerator, DeviceGroup *group) {
    QSignalBlocker blocker(group->mDeviceCombo);

    // save the current selection
    auto const current = group->mDeviceCombo->currentText();

    // rescan the device list and update the combo
    enumerator.populate(group->mApiCombo->currentIndex());
    group->populateDevices(enumerator);

    // search for the current in the new list, defaulting to 0 if not found
    auto index = group->mDeviceCombo->findText(current);
    if (index == -1) {
        // not found, select the first
        index = 0;
        setDirtyFromEnumerator<Enumerator>();
    }
    group->mDeviceCombo->setCurrentIndex(index);
}